

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int handle_script(lua_State *L,char **argx)

{
  int iVar1;
  int iVar2;
  int local_2c;
  char *pcStack_28;
  int narg;
  char *fname;
  int status;
  char **argx_local;
  lua_State *L_local;
  
  pcStack_28 = *argx;
  iVar1 = strcmp(pcStack_28,"-");
  if ((iVar1 == 0) && (iVar1 = strcmp(argx[-1],"--"), iVar1 != 0)) {
    pcStack_28 = (char *)0x0;
  }
  fname._4_4_ = luaL_loadfile(L,pcStack_28);
  if (fname._4_4_ == 0) {
    local_2c = 0;
    lua_getfield(L,0xffffd8ee,"arg");
    iVar2 = lua_type(L,0xffffffff);
    iVar1 = local_2c;
    if (iVar2 == 5) {
      do {
        local_2c = iVar1;
        iVar1 = local_2c + 1;
        lua_rawgeti(L,-iVar1,iVar1);
        iVar2 = lua_type(L);
      } while (iVar2 != 0);
      lua_settop(L,0xfffffffe);
      lua_remove(L,-iVar1);
    }
    else {
      lua_settop(L,0xfffffffe);
    }
    fname._4_4_ = docall(L,local_2c,0);
  }
  iVar1 = report(L,fname._4_4_);
  return iVar1;
}

Assistant:

static int handle_script(lua_State *L, char **argx)
{
  int status;
  const char *fname = argx[0];
  if (strcmp(fname, "-") == 0 && strcmp(argx[-1], "--") != 0)
    fname = NULL;  /* stdin */
  status = luaL_loadfile(L, fname);
  if (status == LUA_OK) {
    /* Fetch args from arg table. LUA_INIT or -e might have changed them. */
    int narg = 0;
    lua_getglobal(L, "arg");
    if (lua_istable(L, -1)) {
      do {
	narg++;
	lua_rawgeti(L, -narg, narg);
      } while (!lua_isnil(L, -1));
      lua_pop(L, 1);
      lua_remove(L, -narg);
      narg--;
    } else {
      lua_pop(L, 1);
    }
    status = docall(L, narg, 0);
  }
  return report(L, status);
}